

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotonic_clock.cpp
# Opt level: O0

HT_TimestampNs ht_monotonic_clock_get_timestamp(void)

{
  HT_TimestampNs HVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  duration<long,_std::ratio<1L,_1000000000L>_> local_10;
  
  local_18.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_10.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_18);
  HVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_10);
  return HVar1;
}

Assistant:

HT_TimestampNs
ht_monotonic_clock_get_timestamp(void)
{
#ifdef HT_MONOTONIC_CLOCK_IMPL_CPP11
    return static_cast<HT_TimestampNs>(std::chrono::steady_clock::now().time_since_epoch().count());
#elif defined(HT_MONOTONIC_CLOCK_IMPL_POSIX)
    struct timespec time;
    // Note: Do we need to link to -lrt to define clock_gettime?
    clock_gettime(CLOCK_MONOTONIC, &time);
    return (HT_TimestampNs) (HT_DUR_S(time.tv_sec) + time.tv_nsec);
#elif defined(HT_MONOTONIC_CLOCK_IMPL_APPLE)
    /* TODO: use mach_absolute_time() instead? */
    clock_serv_t cclock;
    mach_timespec_t time;
    host_get_clock_service(mach_host_self(), SYSTEM_CLOCK, &cclock);
    clock_get_time(cclock, &time);
    mach_port_deallocate(mach_task_self(), cclock);
    return (HT_TimestampNs) (HT_DUR_S(time.tv_sec) + time.tv_nsec);
#elif defined(HT_MONOTONIC_CLOCK_IMPL_WIN32)
    LARGE_INTEGER li;
    QueryPerformanceCounter(&li);
    return (li.QuadPart) * 1000000000 / _ht_msvc_frequency;
#else
#  error "Monotonic clock provider has not been found. Define HT_MONOTONIC_CLOCK_IMPL_CUSTOM" \
    "and provide custom implementation of ht_monotonic_clock_get_timestamp() function"
#endif
}